

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int line_compare(void *v1,void *v2)

{
  line *ln2;
  line *ln1;
  void *v2_local;
  void *v1_local;
  undefined4 local_4;
  
  if (*v1 < *v2) {
    local_4 = -1;
  }
  else if (*v2 < *v1) {
    local_4 = 1;
  }
  else if (*(int *)((long)v1 + 0x14) < *(int *)((long)v2 + 0x14)) {
    local_4 = -1;
  }
  else if (*(int *)((long)v2 + 0x14) < *(int *)((long)v1 + 0x14)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
line_compare (const void *v1, const void *v2)
{
  const struct line *ln1 = (const struct line *) v1;
  const struct line *ln2 = (const struct line *) v2;

  if (ln1->pc < ln2->pc)
    return -1;
  else if (ln1->pc > ln2->pc)
    return 1;
  else if (ln1->idx < ln2->idx)
    return -1;
  else if (ln1->idx > ln2->idx)
    return 1;
  else
    return 0;
}